

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_utffilter.h
# Opt level: O0

void __thiscall JSONUTF8StringFilter::push_back_u(JSONUTF8StringFilter *this,uint codepoint_)

{
  long lVar1;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  uint codepoint__00;
  undefined4 in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x10) != 0) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  if ((in_ESI < 0xd800) || (0xdbff < in_ESI)) {
    codepoint__00 = (uint)((ulong)in_RDI >> 0x20);
    if ((in_ESI < 0xdc00) || (0xdfff < in_ESI)) {
      if (*(int *)(in_RDI + 0x14) == 0) {
        append_codepoint((JSONUTF8StringFilter *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         codepoint__00);
      }
      else {
        *(undefined1 *)(in_RDI + 8) = 0;
      }
    }
    else if (*(int *)(in_RDI + 0x14) == 0) {
      *(undefined1 *)(in_RDI + 8) = 0;
    }
    else {
      append_codepoint((JSONUTF8StringFilter *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                       codepoint__00);
      *(undefined4 *)(in_RDI + 0x14) = 0;
    }
  }
  else if (*(int *)(in_RDI + 0x14) == 0) {
    *(uint *)(in_RDI + 0x14) = in_ESI;
  }
  else {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void push_back_u(unsigned int codepoint_)
    {
        if (state) // Only accept full codepoints in open state
            is_valid = false;
        if (codepoint_ >= 0xD800 && codepoint_ < 0xDC00) { // First half of surrogate pair
            if (surpair) // Two subsequent surrogate pair openers - fail
                is_valid = false;
            else
                surpair = codepoint_;
        } else if (codepoint_ >= 0xDC00 && codepoint_ < 0xE000) { // Second half of surrogate pair
            if (surpair) { // Open surrogate pair, expect second half
                // Compute code point from UTF-16 surrogate pair
                append_codepoint(0x10000 | ((surpair - 0xD800)<<10) | (codepoint_ - 0xDC00));
                surpair = 0;
            } else // Second half doesn't follow a first half - fail
                is_valid = false;
        } else {
            if (surpair) // First half of surrogate pair not followed by second - fail
                is_valid = false;
            else
                append_codepoint(codepoint_);
        }
    }